

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O0

_Bool array_run_container_intersect(array_container_t *src_1,run_container_t *src_2)

{
  _Bool _Var1;
  run_container_t *in_RSI;
  array_container_t *in_RDI;
  uint16_t arrayval;
  rle16_t rle;
  int32_t arraypos;
  int32_t rlepos;
  rle16_t local_24;
  int local_20;
  int local_1c;
  _Bool local_1;
  
  _Var1 = run_container_is_full(in_RSI);
  if (_Var1) {
    _Var1 = array_container_empty(in_RDI);
    local_1 = (_Bool)((_Var1 ^ 0xffU) & 1);
  }
  else if (in_RSI->n_runs == 0) {
    local_1 = false;
  }
  else {
    local_1c = 0;
    local_20 = 0;
    local_24 = *in_RSI->runs;
    for (; local_20 < in_RDI->cardinality;
        local_20 = advanceUntil(in_RDI->array,local_20,in_RDI->cardinality,local_24.value)) {
      while (((uint)local_24 & 0xffff) + ((uint)local_24 >> 0x10) < (uint)in_RDI->array[local_20]) {
        local_1c = local_1c + 1;
        if (local_1c == in_RSI->n_runs) {
          return false;
        }
        local_24 = in_RSI->runs[local_1c];
      }
      if (((uint)local_24 & 0xffff) <= (uint)in_RDI->array[local_20]) {
        return true;
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool array_run_container_intersect(const array_container_t *src_1,
                                   const run_container_t *src_2) {
    if (run_container_is_full(src_2)) {
        return !array_container_empty(src_1);
    }
    if (src_2->n_runs == 0) {
        return false;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                return false;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            return true;
        }
    }
    return false;
}